

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# closureHoisting.cpp
# Opt level: O1

Node * __thiscall
SQCompilation::ClosureHoistingOpt::RemapTransformer::transformDeclExpr
          (RemapTransformer *this,DeclExpr *e)

{
  Node *this_00;
  DeclExpr *pDVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  _Rb_tree_header *p_Var5;
  _Base_ptr p_Var6;
  Chunk *pCVar7;
  _Base_ptr p_Var8;
  FunctionDecl *f;
  
  p_Var5 = &(this->relocSet->
            super_set<SQCompilation::DeclExpr_*,_std::less<SQCompilation::DeclExpr_*>,_StdArenaAllocator<SQCompilation::DeclExpr_*>_>
            )._M_t._M_impl.super__Rb_tree_header;
  p_Var8 = (this->relocSet->
           super_set<SQCompilation::DeclExpr_*,_std::less<SQCompilation::DeclExpr_*>,_StdArenaAllocator<SQCompilation::DeclExpr_*>_>
           )._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  p_Var6 = &p_Var5->_M_header;
  for (; p_Var8 != (_Base_ptr)0x0; p_Var8 = (&p_Var8->_M_left)[*(DeclExpr **)(p_Var8 + 1) < e]) {
    if (*(DeclExpr **)(p_Var8 + 1) >= e) {
      p_Var6 = p_Var8;
    }
  }
  p_Var8 = &p_Var5->_M_header;
  if (((_Rb_tree_header *)p_Var6 != p_Var5) && (p_Var8 = p_Var6, e < *(DeclExpr **)(p_Var6 + 1))) {
    p_Var8 = &p_Var5->_M_header;
  }
  this_00 = (Node *)e->_decl;
  if (((_Rb_tree_header *)p_Var8 == p_Var5) && (this_00->_op == TO_FUNCTION)) {
    p_Var5 = &(this->relocMap->
              super_map<SQCompilation::FunctionDecl_*,_const_char_*,_std::less<SQCompilation::FunctionDecl_*>,_StdArenaAllocator<std::pair<SQCompilation::FunctionDecl_*const,_const_char_*>_>_>
              )._M_t._M_impl.super__Rb_tree_header;
    p_Var8 = (this->relocMap->
             super_map<SQCompilation::FunctionDecl_*,_const_char_*,_std::less<SQCompilation::FunctionDecl_*>,_StdArenaAllocator<std::pair<SQCompilation::FunctionDecl_*const,_const_char_*>_>_>
             )._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    p_Var6 = &p_Var5->_M_header;
    for (; p_Var8 != (_Base_ptr)0x0; p_Var8 = (&p_Var8->_M_left)[*(Node **)(p_Var8 + 1) < this_00])
    {
      if (*(Node **)(p_Var8 + 1) >= this_00) {
        p_Var6 = p_Var8;
      }
    }
    p_Var8 = &p_Var5->_M_header;
    if (((_Rb_tree_header *)p_Var6 != p_Var5) && (p_Var8 = p_Var6, this_00 < *(Node **)(p_Var6 + 1))
       ) {
      p_Var8 = &p_Var5->_M_header;
    }
    if ((_Rb_tree_header *)p_Var8 != p_Var5) {
      p_Var8 = p_Var8[1]._M_parent;
      pCVar7 = Arena::findChunk(this->astArena,0x28);
      pDVar1 = (DeclExpr *)pCVar7->_ptr;
      pCVar7->_ptr = (uint8_t *)(pDVar1 + 1);
      (pDVar1->super_Expr).super_Node._op = TO_ID;
      (pDVar1->super_Expr).super_Node._coordinates.lineStart = -1;
      (pDVar1->super_Expr).super_Node._coordinates.columnStart = -1;
      (pDVar1->super_Expr).super_Node._coordinates.lineEnd = -1;
      (pDVar1->super_Expr).super_Node._coordinates.columnEnd = -1;
      (pDVar1->super_Expr).super_Node.super_ArenaObj._vptr_ArenaObj =
           (_func_int **)&PTR__ArenaObj_001a4900;
      pDVar1->_decl = (Decl *)p_Var8;
      iVar2 = (e->super_Expr).super_Node._coordinates.columnStart;
      iVar3 = (e->super_Expr).super_Node._coordinates.lineEnd;
      iVar4 = (e->super_Expr).super_Node._coordinates.columnEnd;
      (pDVar1->super_Expr).super_Node._coordinates.lineStart =
           (e->super_Expr).super_Node._coordinates.lineStart;
      (pDVar1->super_Expr).super_Node._coordinates.columnStart = iVar2;
      (pDVar1->super_Expr).super_Node._coordinates.lineEnd = iVar3;
      (pDVar1->super_Expr).super_Node._coordinates.columnEnd = iVar4;
      return (Node *)pDVar1;
    }
  }
  Node::transformChildren(this_00,&this->super_Transformer);
  return (Node *)e;
}

Assistant:

Node *ClosureHoistingOpt::RemapTransformer::transformDeclExpr(DeclExpr *e) {

  Decl *d = e->declaration();
  auto it = relocSet.find(e);
  if (it == relocSet.end()) {
    if (d->op() == TO_FUNCTION) {
      FunctionDecl *f = (FunctionDecl *)d;
      auto it = relocMap.find(f);
      if (it != relocMap.end()) {
        return copyCoordinates(e, createId(it->second));
      }
    }
  }

  d->transformChildren(this);
  return e;
}